

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86.cpp
# Opt level: O1

int __thiscall
ncnn::HardSwish_x86::forward_inplace(HardSwish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  _func_int **pp_Var3;
  size_t sVar4;
  size_t sVar5;
  _func_int *p_Var6;
  undefined1 auVar7 [16];
  int iVar8;
  void *pvVar9;
  ulong uVar10;
  float *pfVar11;
  int iVar12;
  long lVar13;
  float fVar14;
  undefined1 auVar15 [16];
  
  auVar7 = _DAT_0031b130;
  uVar2 = bottom_top_blob->c;
  iVar8 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar2) {
      pp_Var3 = this->_vptr_HardSwish_x86;
      uVar10 = 0;
      do {
        if (0 < iVar8) {
          pfVar11 = (float *)(bottom_top_blob->cstep * uVar10 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          iVar12 = iVar8;
          do {
            fVar1 = *(float *)(&this->field_0xd0 + (long)pp_Var3[-3]);
            fVar14 = *(float *)(&this->field_0xd4 + (long)pp_Var3[-3]);
            auVar15._0_4_ = fVar1 * *pfVar11 + fVar14;
            auVar15._4_4_ = fVar1 * pfVar11[1] + fVar14;
            auVar15._8_4_ = fVar1 * pfVar11[2] + fVar14;
            auVar15._12_4_ = fVar1 * pfVar11[3] + fVar14;
            auVar15 = maxps(auVar15,ZEXT816(0));
            auVar15 = minps(auVar15,auVar7);
            *pfVar11 = auVar15._0_4_ * *pfVar11;
            pfVar11[1] = auVar15._4_4_ * pfVar11[1];
            pfVar11[2] = auVar15._8_4_ * pfVar11[2];
            pfVar11[3] = auVar15._12_4_ * pfVar11[3];
            pfVar11 = pfVar11 + 4;
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar2);
    }
  }
  else if (0 < (int)uVar2) {
    pvVar9 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->cstep;
    pp_Var3 = this->_vptr_HardSwish_x86;
    sVar5 = bottom_top_blob->elemsize;
    uVar10 = 0;
    do {
      if (0 < iVar8) {
        lVar13 = 0;
        do {
          fVar1 = *(float *)((long)pvVar9 + lVar13 * 4);
          p_Var6 = pp_Var3[-3];
          fVar14 = 0.0;
          if (fVar1 < *(float *)(&this->field_0xd8 + (long)p_Var6)) {
LAB_002fefb0:
            *(float *)((long)pvVar9 + lVar13 * 4) = fVar14;
          }
          else if (fVar1 < *(float *)(&this->field_0xdc + (long)p_Var6) ||
                   fVar1 == *(float *)(&this->field_0xdc + (long)p_Var6)) {
            fVar14 = (*(float *)(&this->field_0xd0 + (long)p_Var6) * fVar1 +
                     *(float *)(&this->field_0xd4 + (long)p_Var6)) * fVar1;
            goto LAB_002fefb0;
          }
          lVar13 = lVar13 + 1;
        } while (iVar8 != (int)lVar13);
      }
      uVar10 = uVar10 + 1;
      pvVar9 = (void *)((long)pvVar9 + sVar4 * sVar5);
    } while (uVar10 != uVar2);
  }
  return 0;
}

Assistant:

int HardSwish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _zero = _mm256_set1_ps(0.f);
            __m256 _one = _mm256_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ans = _mm256_set1_ps(beta);
                _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
                _ans = _mm256_max_ps(_ans, _zero);
                _ans = _mm256_min_ps(_ans, _one);
                _ans = _mm256_mul_ps(_ans, _p);
                _mm256_storeu_ps(ptr, _ans);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _zero = _mm_set1_ps(0.f);
            __m128 _one = _mm_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _ans = _mm_set1_ps(beta);
                _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
                _ans = _mm_max_ps(_ans, _zero);
                _ans = _mm_min_ps(_ans, _one);
                _ans = _mm_mul_ps(_ans, _p);
                _mm_storeu_ps(ptr, _ans);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __AVX__
        __m256 _zero = _mm256_set1_ps(0.f);
        __m256 _one = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero);
            _ans = _mm256_min_ps(_ans, _one);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);

            ptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ++ptr;
        }
    }

    return 0;
}